

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressOperations.cpp
# Opt level: O0

void gmlc::networking::insertProtocol(string *networkAddress,InterfaceTypes interfaceT)

{
  size_type sVar1;
  undefined1 in_SIL;
  char *unaff_retaddr;
  undefined7 in_stack_00000008;
  
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (networkAddress,(char *)CONCAT17(interfaceT,in_stack_00000008),
                     (size_type)unaff_retaddr);
  if (sVar1 == 0xffffffffffffffff) {
    switch(in_SIL) {
    case 0:
    case 2:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)networkAddress
                 ,CONCAT17(interfaceT,in_stack_00000008),unaff_retaddr);
      break;
    case 1:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)networkAddress
                 ,CONCAT17(interfaceT,in_stack_00000008),unaff_retaddr);
      break;
    case 3:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)networkAddress
                 ,CONCAT17(interfaceT,in_stack_00000008),unaff_retaddr);
      break;
    case 4:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)networkAddress
                 ,CONCAT17(interfaceT,in_stack_00000008),unaff_retaddr);
    }
  }
  return;
}

Assistant:

void insertProtocol(std::string& networkAddress, InterfaceTypes interfaceT)
{
    if (networkAddress.find("://") == std::string::npos) {
        switch (interfaceT) {
            case InterfaceTypes::IP:
            case InterfaceTypes::TCP:
                networkAddress.insert(0, "tcp://");
                break;
            case InterfaceTypes::IPC:
                networkAddress.insert(0, "ipc://");
                break;
            case InterfaceTypes::UDP:
                networkAddress.insert(0, "udp://");
                break;
            case InterfaceTypes::INPROC:
                networkAddress.insert(0, "inproc://");
                break;
        }
    }
}